

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lh_record_insert(unqlite_kv_engine *pKv,void *pKey,sxu32 nKeyLen,void *pData,
                    unqlite_int64 nDataLen,int is_append)

{
  pgno iReal;
  bool bVar1;
  uint nHash_00;
  int iVar2;
  lhcell *pCell_00;
  int local_7c;
  int local_78;
  int rc;
  int iCnt;
  sxu32 nHash;
  pgno iBucket;
  lhcell *pCell;
  lhpage *pPage;
  unqlite_page *pRaw;
  lhash_bmap_rec *pRec;
  lhash_kv_engine *pEngine;
  unqlite_int64 uStack_38;
  int is_append_local;
  unqlite_int64 nDataLen_local;
  void *pData_local;
  void *pvStack_20;
  sxu32 nKeyLen_local;
  void *pKey_local;
  unqlite_kv_engine *pKv_local;
  
  pRec = (lhash_bmap_rec *)pKv;
  pEngine._4_4_ = is_append;
  uStack_38 = nDataLen;
  nDataLen_local = (unqlite_int64)pData;
  pData_local._4_4_ = nKeyLen;
  pvStack_20 = pKey;
  pKey_local = pKv;
  pKv_local._4_4_ = (*pKv->pIo->xGet)(pKv->pIo->pHandle,1,(unqlite_page **)(pKv + 0x1a));
  if (pKv_local._4_4_ == 0) {
    local_78 = 0;
    nHash_00 = (*(code *)pRec[4].iLogic)(pvStack_20,pData_local._4_4_);
    while( true ) {
      _iCnt = (ulong)nHash_00 & (ulong)((long)&pRec[6].pNext[-1].pPrevCol + 7U);
      if (pRec[6].iLogic + pRec[6].iReal <= _iCnt) {
        _iCnt = (ulong)nHash_00 & pRec[6].iReal - 1;
      }
      pRaw = (unqlite_page *)lhMapFindBucket((lhash_kv_engine *)pRec,_iCnt);
      if ((lhash_bmap_rec *)pRaw == (lhash_bmap_rec *)0x0) {
        iVar2 = lhAcquirePage((lhash_kv_engine *)pRec,(unqlite_page **)&pPage);
        if (iVar2 != 0) {
          return iVar2;
        }
        pCell = (lhcell *)lhNewPage((lhash_kv_engine *)pRec,(unqlite_page *)pPage,(lhpage *)0x0);
        if (pCell == (lhcell *)0x0) {
          return -1;
        }
        iVar2 = lhSetEmptyPage((lhpage *)pCell);
        if (iVar2 != 0) {
          (**(code **)(pRec->iLogic + 0x50))(pPage);
          return iVar2;
        }
        local_7c = lhStoreCell((lhpage *)pCell,pvStack_20,pData_local._4_4_,(void *)nDataLen_local,
                               uStack_38,nHash_00,1);
        if (local_7c == 0) {
          iReal._0_2_ = (pPage->sHdr).iOfft;
          iReal._2_2_ = (pPage->sHdr).iFree;
          iReal._4_4_ = *(undefined4 *)&(pPage->sHdr).field_0x4;
          local_7c = lhMapWriteRecord((lhash_kv_engine *)pRec,_iCnt,iReal);
        }
        (**(code **)(pRec->iLogic + 0x50))(pPage);
        return local_7c;
      }
      iVar2 = lhLoadPage((lhash_kv_engine *)pRec,((lhash_bmap_rec *)pRaw)->iReal,(lhpage *)0x0,
                         (lhpage **)&pCell,0);
      if (iVar2 != 0) {
        return iVar2;
      }
      (**(code **)(pRec->iLogic + 0x40))(pCell->nData);
      pCell_00 = lhFindCell((lhpage *)pCell,pvStack_20,pData_local._4_4_,nHash_00);
      if (pCell_00 != (lhcell *)0x0) break;
      local_7c = lhRecordInstall((lhpage *)pCell,nHash_00,pvStack_20,pData_local._4_4_,
                                 (void *)nDataLen_local,uStack_38);
      if ((local_7c != -0x21) || (bVar1 = 1 < local_78, local_78 = local_78 + 1, bVar1))
      goto LAB_001178ce;
    }
    if (pEngine._4_4_ == 0) {
      local_7c = lhRecordOverwrite(pCell_00,(void *)nDataLen_local,uStack_38);
    }
    else {
      local_7c = lhRecordAppend(pCell_00,(void *)nDataLen_local,uStack_38);
    }
LAB_001178ce:
    (**(code **)(pRec->iLogic + 0x50))(pCell->nData);
    pKv_local._4_4_ = local_7c;
  }
  return pKv_local._4_4_;
}

Assistant:

static int lh_record_insert(
	  unqlite_kv_engine *pKv,         /* KV store */
	  const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	  const void *pData,unqlite_int64 nDataLen, /* Payload: data */
	  int is_append /* True for an append operation */
	  )
{
	lhash_kv_engine *pEngine = (lhash_kv_engine *)pKv;
	lhash_bmap_rec *pRec;
	unqlite_page *pRaw;
	lhpage *pPage;
	lhcell *pCell;
	pgno iBucket;
	sxu32 nHash;
	int iCnt;
	int rc;

	/* Acquire the first page (DB hash Header) so that everything gets loaded automatically */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iCnt = 0;
	/* Compute the hash of the key first */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
retry:
	/* Extract the logical bucket number */
	iBucket = nHash & (pEngine->nmax_split_nucket - 1);
	if( iBucket >= pEngine->split_bucket + pEngine->max_split_bucket ){
		/* Low mask */
		iBucket = nHash & (pEngine->max_split_bucket - 1);
	}
	/* Map the logical bucket number to real page number */
	pRec = lhMapFindBucket(pEngine,iBucket);
	if( pRec == 0 ){
		/* Request a new page */
		rc = lhAcquirePage(pEngine,&pRaw);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initialize the page */
		pPage = lhNewPage(pEngine,pRaw,0);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Mark as an empty page */
		rc = lhSetEmptyPage(pPage);
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pRaw); /* pPage will be released during this call */
			return rc;
		}
		/* Store the cell */
		rc = lhStoreCell(pPage,pKey,nKeyLen,pData,nDataLen,nHash,1);
		if( rc == UNQLITE_OK ){
			/* Install and write the logical map record */
			rc = lhMapWriteRecord(pEngine,iBucket,pRaw->iPage);
		}
		pEngine->pIo->xPageUnref(pRaw);
		return rc;
	}else{
		/* Load the page */
		rc = lhLoadPage(pEngine,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			/* IO error, unlikely scenario */
			return rc;
		}
		/* Do not add this page to the hot dirty list */
		pEngine->pIo->xDontMkHot(pPage->pRaw);
		/* Lookup for the cell */
		pCell = lhFindCell(pPage,pKey,(sxu32)nKeyLen,nHash);
		if( pCell == 0 ){
			/* Create the record */
			rc = lhRecordInstall(pPage,nHash,pKey,nKeyLen,pData,nDataLen);
			if( rc == SXERR_RETRY && iCnt++ < 2 ){
				rc = UNQLITE_OK;
				goto retry;
			}
		}else{
			if( is_append ){
				/* Append operation */
				rc = lhRecordAppend(pCell,pData,nDataLen);
			}else{
				/* Overwrite old value */
				rc = lhRecordOverwrite(pCell,pData,nDataLen);
			}
		}
		pEngine->pIo->xPageUnref(pPage->pRaw);
	}
	return rc;
}